

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimPatValues(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  Vec_Wrd_t *__ptr;
  Vec_Wrd_t *pVVar8;
  word *__s;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  iVar11 = p->vSimsPi->nSize / p->vCis->nSize;
  __ptr = Gia_ManSimPatSim(p);
  pVVar4 = p->vCos;
  uVar1 = pVVar4->nSize;
  iVar9 = uVar1 * iVar11;
  pVVar8 = (Vec_Wrd_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar6 = iVar9;
  }
  pVVar8->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  pVVar8->pArray = __s;
  pVVar8->nSize = iVar9;
  memset(__s,0,(long)iVar9 * 8);
  if (p->vSimsPi->nSize != p->vCis->nSize * iVar11) {
    __assert_fail("Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xef,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  iVar6 = __ptr->nSize;
  iVar2 = p->nObjs;
  if (iVar6 != iVar2 * iVar11) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0xf1,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  if (0 < (int)uVar1) {
    piVar5 = pVVar4->pArray;
    lVar12 = 0;
    uVar10 = 0;
    do {
      iVar3 = piVar5[uVar10];
      if ((iVar3 < 0) || (iVar2 <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar3 == 0) break;
      if ((((lVar12 < 0) || (iVar9 <= lVar12)) || (uVar7 = iVar3 * iVar11, (int)uVar7 < 0)) ||
         (iVar6 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      memcpy(__s + lVar12,__ptr->pArray + uVar7,(long)iVar11 * 8);
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + iVar11;
    } while (uVar10 < uVar1);
  }
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return pVVar8;
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatValues( Gia_Man_t * p )
{
    int i, Id, nWords   = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vSims   = Gia_ManSimPatSim( p ); 
    Vec_Wrd_t * vValues = Vec_WrdStart( Gia_ManCoNum(p)  * nWords ); 
    assert( Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)  );
    assert( Vec_WrdSize(vValues)    == nWords * Gia_ManCoNum(p)  );
    assert( Vec_WrdSize(vSims)      == nWords * Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        memcpy( Vec_WrdEntryP(vValues, nWords * i), Vec_WrdEntryP(vSims, nWords * Id), sizeof(word)* nWords );
    Vec_WrdFree( vSims );
    return vValues;
}